

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

void duckdb::FSSTStorage::StringFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  ulong uVar1;
  bitpacking_width_t width;
  uint uVar2;
  uint uVar3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  anon_union_16_2_67f50693_for_value aVar6;
  ColumnSegment *segment_00;
  u32 uVar7;
  BufferManager *pBVar8;
  unsigned_long uVar9;
  type puVar10;
  VectorStringBuffer *str_buffer;
  uint uVar11;
  char *compressed_string_00;
  ulong uVar12;
  long lVar13;
  fsst_compression_header_t *header_ptr;
  data_ptr_t pdVar14;
  string_t sVar15;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true> bitunpack_buffer;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true> delta_decode_buffer;
  string_t compressed_string;
  BufferHandle handle;
  duckdb_fsst_decoder_t decoder;
  _Head_base<0UL,_unsigned_int_*,_false> local_9a0;
  undefined1 local_998 [8];
  undefined8 uStack_990;
  _Head_base<0UL,_unsigned_int_*,_false> local_988;
  uint32_t local_980;
  char local_97c [4];
  undefined4 local_978;
  undefined4 uStack_974;
  Vector *local_970;
  idx_t local_968;
  data_ptr_t local_960;
  ColumnSegment *local_958;
  data_ptr_t local_950;
  BufferHandle local_948;
  duckdb_fsst_decoder_t local_930;
  
  local_968 = result_idx;
  pBVar8 = BufferManager::GetBufferManager(segment->db);
  (*pBVar8->_vptr_BufferManager[7])(&local_948,pBVar8,&segment->block);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_948.node);
  pdVar14 = (local_948.node.ptr)->buffer;
  iVar4 = segment->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_948.node);
  uVar2 = *(uint *)((local_948.node.ptr)->buffer + segment->offset + 4);
  width = pdVar14[iVar4 + 8];
  local_958 = segment;
  local_950 = pdVar14;
  uVar7 = duckdb_fsst_import(&local_930,pdVar14 + *(uint *)(pdVar14 + iVar4 + 0xc) + iVar4);
  pdVar5 = result->data;
  if (uVar7 == 0) {
    pdVar5 = pdVar5 + local_968 * 0x10;
    pdVar5[0] = '\0';
    pdVar5[1] = '\0';
    pdVar5[2] = '\0';
    pdVar5[3] = '\0';
    pdVar5[4] = '\0';
    pdVar5[5] = '\0';
    pdVar5[6] = '\0';
    pdVar5[7] = '\0';
    pdVar5[8] = '\0';
    pdVar5[9] = '\0';
    pdVar5[10] = '\0';
    pdVar5[0xb] = '\0';
    pdVar5[0xc] = '\0';
    pdVar5[0xd] = '\0';
    pdVar5[0xe] = '\0';
    pdVar5[0xf] = '\0';
  }
  else {
    uVar1 = row_id + 1;
    uVar12 = uVar1;
    local_970 = result;
    local_960 = pdVar5;
    if ((uVar1 & 0x1f) != 0) {
      uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar1 & 0x1f);
      uVar12 = (row_id - uVar9) + 0x21;
    }
    local_9a0._M_head_impl = (uint *)operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | uVar12 * 4);
    BitUnpackRange(local_950 + iVar4 + 0x10,(data_ptr_t)local_9a0._M_head_impl,uVar12,0,width);
    uVar12 = 0xffffffffffffffff;
    if (uVar1 < 0x4000000000000000) {
      uVar12 = uVar1 * 4;
    }
    local_988._M_head_impl = (uint *)operator_new__(uVar12);
    segment_00 = local_958;
    *local_988._M_head_impl = *local_9a0._M_head_impl;
    if (1 < uVar1) {
      uVar11 = *local_988._M_head_impl;
      lVar13 = 0;
      do {
        uVar11 = uVar11 + (local_9a0._M_head_impl + 1)[lVar13];
        (local_988._M_head_impl + 1)[lVar13] = uVar11;
        lVar13 = lVar13 + 1;
      } while (row_id != lVar13);
    }
    puVar10 = unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true>::operator[]
                        ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true> *)
                         &local_9a0,row_id);
    uVar11 = *puVar10;
    puVar10 = unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true>::operator[]
                        ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true> *)
                         &local_988,row_id);
    uVar3 = *puVar10;
    lVar13 = uVar2 + iVar4;
    if ((long)(int)uVar3 < 0) {
      _local_998 = (anon_struct_16_3_d7536bce_for_pointer)
                   UncompressedStringStorage::ReadOverflowString
                             (segment_00,local_970,
                              *(block_id_t *)(pdVar14 + (lVar13 - (ulong)-uVar3)),
                              (int32_t)*(block_id_t *)
                                        ((long)(pdVar14 + (lVar13 - (ulong)-uVar3)) + 8));
    }
    else {
      pdVar14 = pdVar14 + (lVar13 - (int)uVar3);
      if (uVar11 < 0xd) {
        _local_998 = (anon_union_16_2_67f50693_for_value)ZEXT416(uVar11);
        if (uVar11 != 0) {
          switchD_015ff80e::default(local_998 + 4,pdVar14,(ulong)uVar11);
        }
      }
      else {
        local_998._4_4_ = *(undefined4 *)pdVar14;
        local_998._0_4_ = uVar11;
        uStack_990 = pdVar14;
      }
    }
    aVar6 = _local_998;
    local_980 = local_998._0_4_;
    local_97c[0] = local_998[4];
    local_97c[1] = local_998[5];
    local_97c[2] = local_998[6];
    local_97c[3] = local_998[7];
    uStack_990._0_4_ = aVar6._8_4_;
    local_978 = (undefined4)uStack_990;
    uStack_990._4_4_ = aVar6._12_4_;
    uStack_974 = uStack_990._4_4_;
    _local_998 = aVar6;
    str_buffer = StringVector::GetStringBuffer(local_970);
    pdVar5 = local_960;
    iVar4 = local_968;
    if ((ulong)local_980 < 0xd) {
      compressed_string_00 = local_97c;
    }
    else {
      compressed_string_00 = (char *)CONCAT44(uStack_974,local_978);
    }
    sVar15 = FSSTPrimitives::DecompressValue
                       (&local_930,str_buffer,compressed_string_00,(ulong)local_980);
    *(long *)(pdVar5 + iVar4 * 0x10) = sVar15.value._0_8_;
    *(long *)(pdVar5 + iVar4 * 0x10 + 8) = sVar15.value._8_8_;
    if (local_988._M_head_impl != (uint *)0x0) {
      operator_delete__(local_988._M_head_impl);
    }
    if (local_9a0._M_head_impl != (uint *)0x0) {
      operator_delete__(local_9a0._M_head_impl);
    }
  }
  BufferHandle::~BufferHandle(&local_948);
  return;
}

Assistant:

void FSSTStorage::StringFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                                 idx_t result_idx) {

	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	auto base_ptr = handle.Ptr() + segment.GetBlockOffset();
	auto base_data = data_ptr_cast(base_ptr + sizeof(fsst_compression_header_t));
	auto dict = GetDictionary(segment, handle);

	duckdb_fsst_decoder_t decoder;
	bitpacking_width_t width;
	auto have_symbol_table = ParseFSSTSegmentHeader(base_ptr, &decoder, &width);

	auto result_data = FlatVector::GetData<string_t>(result);
	if (!have_symbol_table) {
		// There is no FSST symtable. This is only the case for empty strings or NULLs. We emit an empty string.
		result_data[result_idx] = string_t(nullptr, 0);
		return;
	}

	// We basically just do a scan of 1 which is kinda expensive as we need to repeatedly delta decode until we
	// reach the row we want, we could consider a more clever caching trick if this is slow
	auto offsets = CalculateBpDeltaOffsets(-1, UnsafeNumericCast<idx_t>(row_id), 1);

	auto bitunpack_buffer = unique_ptr<uint32_t[]>(new uint32_t[offsets.total_bitunpack_count]);
	BitUnpackRange(base_data, data_ptr_cast(bitunpack_buffer.get()), offsets.total_bitunpack_count,
	               offsets.bitunpack_start_row, width);
	auto delta_decode_buffer = unique_ptr<uint32_t[]>(new uint32_t[offsets.total_delta_decode_count]);
	DeltaDecodeIndices(bitunpack_buffer.get() + offsets.bitunpack_alignment_offset, delta_decode_buffer.get(),
	                   offsets.total_delta_decode_count, 0);

	uint32_t string_length = bitunpack_buffer[offsets.scan_offset];

	string_t compressed_string = UncompressedStringStorage::FetchStringFromDict(
	    segment, dict.end, result, base_ptr,
	    UnsafeNumericCast<int32_t>(delta_decode_buffer[offsets.unused_delta_decoded_values]), string_length);

	auto &str_buffer = StringVector::GetStringBuffer(result);
	result_data[result_idx] = FSSTPrimitives::DecompressValue((void *)&decoder, str_buffer, compressed_string.GetData(),
	                                                          compressed_string.GetSize());
}